

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.c
# Opt level: O2

int Mio_CommandWriteProfile(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  FILE *pFVar2;
  void *pvVar3;
  Mio_Library_t *pLib;
  char *pcVar4;
  
  Abc_FrameReadOut(pAbc);
  pFVar2 = (FILE *)Abc_FrameReadErr(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    pvVar3 = Abc_FrameReadLibGen();
    if (pvVar3 == (void *)0x0) {
      pcVar4 = "Library is not available.";
    }
    else {
      if (globalUtilOptind + 1 == argc) {
        pcVar4 = argv[globalUtilOptind];
        pFVar2 = fopen(pcVar4,"w");
        if (pFVar2 == (FILE *)0x0) {
          printf("Error! Cannot open file \"%s\" for writing the library.\n",pcVar4);
          return 1;
        }
        pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
        Mio_LibraryWriteProfile((FILE *)pFVar2,pLib);
        fclose(pFVar2);
        printf("The current profile is written into file \"%s\".\n",pcVar4);
        return 0;
      }
      pcVar4 = "The file name is not given.";
    }
    puts(pcVar4);
  }
  else {
    fwrite("\nusage: write_profile [-h] <file>\n",0x22,1,pFVar2);
    fwrite("\t          writes the current profile into a file\n",0x32,1,pFVar2);
    fwrite("\t-h      : print the command usage\n",0x23,1,pFVar2);
    fwrite("\t<file>  : file name to write the profile\n",0x2a,1,pFVar2);
  }
  return 1;
}

Assistant:

int Mio_CommandWriteProfile( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pOut, * pErr, * pFile;
    char * pFileName;
    int c;

    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "h")) != EOF ) 
    {
        switch (c) 
        {
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }
    if ( Abc_FrameReadLibGen() == NULL )
    {
        printf( "Library is not available.\n" );
        return 1;
    }
    if ( argc != globalUtilOptind + 1 )
    {
        printf( "The file name is not given.\n" );
        return 1;
    }

    pFileName = argv[globalUtilOptind];
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Error! Cannot open file \"%s\" for writing the library.\n", pFileName );
        return 1;
    }
    Mio_LibraryWriteProfile( pFile, (Mio_Library_t *)Abc_FrameReadLibGen() );
    fclose( pFile );
    printf( "The current profile is written into file \"%s\".\n", pFileName );
    return 0;

usage:
    fprintf( pErr, "\nusage: write_profile [-h] <file>\n");
    fprintf( pErr, "\t          writes the current profile into a file\n" );  
    fprintf( pErr, "\t-h      : print the command usage\n");
    fprintf( pErr, "\t<file>  : file name to write the profile\n");
    return 1;       
}